

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  FieldType type;
  int number;
  bool packed;
  uint32_t uVar1;
  int local_2c;
  
  local_2c = value;
  if ((field->field_0x1 & 8) == 0) {
    AddField<int>(this,message,field,&local_2c);
    return;
  }
  uVar1 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  number = field->number_;
  type = field->type_;
  packed = FieldDescriptor::is_packed(field);
  internal::ExtensionSet::AddEnum
            ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
             number,type,packed,value,field);
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->is_packed(), value, field);
  } else {
    AddField<int>(message, field, value);
  }
}